

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture1DArray_GL.cpp
# Opt level: O1

void __thiscall
Diligent::Texture1DArray_GL::Texture1DArray_GL
          (Texture1DArray_GL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,GLuint GLTextureHandle,GLuint GLBindTarget,
          bool bIsDeviceInternal)

{
  GLenum BindTarget;
  
  BindTarget = 0x8c18;
  if (GLBindTarget != 0) {
    BindTarget = GLBindTarget;
  }
  TextureBaseGL::TextureBaseGL
            (&this->super_TextureBaseGL,pRefCounters,TexViewObjAllocator,pDeviceGL,GLState,TexDesc,
             GLTextureHandle,BindTarget,bIsDeviceInternal);
  (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture = (ITexture)&PTR_QueryInterface_00b06140;
  return;
}

Assistant:

Texture1DArray_GL::Texture1DArray_GL(IReferenceCounters*        pRefCounters,
                                     FixedBlockMemoryAllocator& TexViewObjAllocator,
                                     RenderDeviceGLImpl*        pDeviceGL,
                                     GLContextState&            GLState,
                                     const TextureDesc&         TexDesc,
                                     GLuint                     GLTextureHandle,
                                     GLuint                     GLBindTarget,
                                     bool                       bIsDeviceInternal) :
    // clang-format off
    TextureBaseGL
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        GLState,
        TexDesc,
        GLTextureHandle,
        static_cast<GLenum>(GLBindTarget != 0 ? GLBindTarget : GL_TEXTURE_1D_ARRAY),
        bIsDeviceInternal
    }
// clang-format on
{
}